

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSTypeName_abi_cxx11_
                   (GeneratorOptions *options,FieldDescriptor *field,BytesMode bytes_mode)

{
  CppType CVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  FieldDescriptor *in_stack_ffffffffffffff90;
  EnumDescriptor *in_stack_ffffffffffffffd0;
  GeneratorOptions *in_stack_ffffffffffffffd8;
  allocator local_1d [13];
  FieldDescriptor *local_10;
  
  local_10 = in_RSI;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x46fdee);
  field_00 = (FieldDescriptor *)(ulong)(CVar1 - CPPTYPE_INT32);
  switch(field_00) {
  case (FieldDescriptor *)0x0:
    JSIntegerTypeName_abi_cxx11_(field_00);
    break;
  case (FieldDescriptor *)0x1:
    JSIntegerTypeName_abi_cxx11_(field_00);
    break;
  case (FieldDescriptor *)0x2:
    JSIntegerTypeName_abi_cxx11_(field_00);
    break;
  case (FieldDescriptor *)0x3:
    JSIntegerTypeName_abi_cxx11_(field_00);
    break;
  case (FieldDescriptor *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"number",(allocator *)&stack0xffffffffffffffd2);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd2);
    break;
  case (FieldDescriptor *)0x5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"number",(allocator *)&stack0xffffffffffffffd3);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
    break;
  case (FieldDescriptor *)0x6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"boolean",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case (FieldDescriptor *)0x7:
    FieldDescriptor::enum_type(in_stack_ffffffffffffff90);
    GetEnumPath_abi_cxx11_(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    break;
  case (FieldDescriptor *)0x8:
    JSStringTypeName_abi_cxx11_
              (in_stack_ffffffffffffffd8,(FieldDescriptor *)in_stack_ffffffffffffffd0,BYTES_DEFAULT)
    ;
    break;
  case (FieldDescriptor *)0x9:
    FieldDescriptor::message_type(local_10);
    GetMessagePath_abi_cxx11_(in_stack_ffffffffffffffd8,(Descriptor *)in_stack_ffffffffffffffd0);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",(allocator *)&stack0xffffffffffffffd1);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd1);
  }
  return in_RDI;
}

Assistant:

std::string JSTypeName(const GeneratorOptions& options,
                       const FieldDescriptor* field, BytesMode bytes_mode) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return "boolean";
    case FieldDescriptor::CPPTYPE_INT32:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_INT64:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_UINT32:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_UINT64:
      return JSIntegerTypeName(field);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "number";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "number";
    case FieldDescriptor::CPPTYPE_STRING:
      return JSStringTypeName(options, field, bytes_mode);
    case FieldDescriptor::CPPTYPE_ENUM:
      return GetEnumPath(options, field->enum_type());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return GetMessagePath(options, field->message_type());
    default:
      return "";
  }
}